

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declared_rooms.h
# Opt level: O0

void __thiscall Graveyard::Graveyard(Graveyard *this)

{
  mapped_type *pmVar1;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  Graveyard *local_10;
  Graveyard *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "A thick layer of fog covers the graveyard soil. Tombstones jut out here and there and an eerie willow tree looms over your head, obstructing the full moon partially. Off in the distance you see the northern gates -- the only entrance into this forsaken place."
             ,&local_31);
  Room::Room(&this->super_Room,1,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_Room)._vptr_Room = (_func_int **)&PTR_describe_abi_cxx11__0014ac30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"north",&local_69);
  pmVar1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&(this->super_Room).exits,(key_type *)local_68);
  *pmVar1 = 2;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

Graveyard() : Room(Map::Location::GRAVEYARD, "A thick layer of fog covers the graveyard soil. Tombstones jut out here and there and an eerie willow tree looms over your head, obstructing the full moon partially. Off in the distance you see the northern gates -- the only entrance into this forsaken place.") 
  {
    exits["north"] = Map::Location::GRAVEYARD_GATES;
  }